

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::CanProveConditionalBranch
          (GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,Var src1Var,Var src2Var,
          bool *result)

{
  ValueInfo *pVVar1;
  ulong uVar2;
  bool bVar3;
  ObjectType OVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 uVar6;
  Func *pFVar7;
  ValueType *pVVar8;
  ValueType *pVVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  double value;
  ulong local_48;
  int64 right64;
  int64 left64;
  int32 left;
  int32 right;
  
  bVar3 = false;
  switch(instr->m_opcode) {
  case BrNotEq_A:
switchD_0046166f_caseD_194:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
        bVar3 = (uint)left64 == left64._4_4_;
        goto LAB_004627e2;
      }
      bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)&DAT_00000001,
                         (bool)uVar6);
      if (bVar3) goto LAB_0046253f;
    }
    if (src1Var == (Var)0x0 || src2Var == (Var)0x0) {
      bVar3 = anon_unknown.dwarf_ea234d::BoolAndIntStaticAndTypeMismatch
                        (src1Val,src2Val,src1Var,src2Var);
LAB_00462667:
      bVar10 = true;
      if (bVar3 != false) break;
    }
    else {
      pFVar7 = this->func;
      bVar3 = false;
LAB_00462568:
      bVar3 = anon_unknown.dwarf_ea234d::Op_JitEq
                        (result,src1Val,src2Val,src1Var,src2Var,pFVar7,bVar3);
      if (bVar3) {
        bVar10 = *result;
        goto LAB_0046258a;
      }
    }
    goto LAB_004628a0;
  case BrNotNeq_A:
switchD_0046166f_caseD_195:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
        bVar10 = (uint)left64 == left64._4_4_;
      }
      else {
        bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)&DAT_00000001,
                           (bool)uVar6);
        bVar10 = true;
        if (!bVar3) goto LAB_004625b2;
      }
      break;
    }
LAB_004625b2:
    if (src1Var == (Var)0x0 || src2Var == (Var)0x0) {
      bVar3 = anon_unknown.dwarf_ea234d::BoolAndIntStaticAndTypeMismatch
                        (src1Val,src2Val,src1Var,src2Var);
      goto LAB_00462618;
    }
    pFVar7 = this->func;
    bVar3 = false;
LAB_004625d0:
    bVar3 = anon_unknown.dwarf_ea234d::Op_JitEq(result,src1Val,src2Val,src1Var,src2Var,pFVar7,bVar3)
    ;
    if (!bVar3) goto LAB_004628a0;
    goto LAB_004627eb;
  case BrSrNotEq_A:
switchD_0046166f_caseD_196:
    uVar6 = src2Var != (Var)0x0;
    if (src1Var != (Var)0x0 && (bool)uVar6) {
      pFVar7 = this->func;
      bVar3 = true;
      goto LAB_00462568;
    }
    pVVar1 = src2Val->valueInfo;
    pVVar8 = &src1Val->valueInfo->super_ValueType;
    bVar3 = ValueType::IsUndefined(pVVar8);
    if (bVar3) {
      bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
      if (bVar3) {
        bVar3 = ValueType::HasBeenUndefined(&pVVar1->super_ValueType);
        bVar10 = true;
        if (!bVar3) break;
      }
    }
    bVar3 = ValueType::IsNull(pVVar8);
    if (bVar3) {
      bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
      if (bVar3) {
        bVar3 = ValueType::HasBeenNull(&pVVar1->super_ValueType);
        bVar10 = true;
        if (!bVar3) break;
      }
    }
    bVar3 = ValueType::IsBoolean(pVVar8);
    if (bVar3) {
      bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
      if (bVar3) {
        bVar3 = ValueType::HasBeenBoolean(&pVVar1->super_ValueType);
        bVar10 = true;
        if (!bVar3) break;
      }
    }
    bVar3 = ValueType::IsNumber(pVVar8);
    if (bVar3) {
      bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
      if (bVar3) {
        bVar3 = ValueType::HasBeenNumber(&pVVar1->super_ValueType);
        bVar10 = true;
        if (!bVar3) break;
      }
    }
    bVar3 = ValueType::IsString(pVVar8);
    if (bVar3) {
      bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
      if (bVar3) {
        bVar3 = ValueType::HasBeenString(&pVVar1->super_ValueType);
        bVar10 = true;
        if (!bVar3) break;
      }
    }
    pVVar9 = &pVVar1->super_ValueType;
    bVar3 = ValueType::IsUndefined(pVVar9);
    if ((bVar3) && (bVar3 = ValueType::IsDefinite(pVVar8), bVar3)) {
      bVar3 = ValueType::HasBeenUndefined(pVVar8);
      bVar10 = true;
      if (!bVar3) break;
    }
    bVar3 = ValueType::IsNull(pVVar9);
    if ((bVar3) && (bVar3 = ValueType::IsDefinite(pVVar8), bVar3)) {
      bVar3 = ValueType::HasBeenNull(pVVar8);
      bVar10 = true;
      if (!bVar3) break;
    }
    bVar3 = ValueType::IsBoolean(pVVar9);
    if ((bVar3) && (bVar3 = ValueType::IsDefinite(pVVar8), bVar3)) {
      bVar3 = ValueType::HasBeenBoolean(pVVar8);
      bVar10 = true;
      if (!bVar3) break;
    }
    bVar3 = ValueType::IsNumber(pVVar9);
    if ((bVar3) && (bVar3 = ValueType::IsDefinite(pVVar8), bVar3)) {
      bVar3 = ValueType::HasBeenNumber(pVVar8);
      bVar10 = true;
      if (!bVar3) break;
    }
    bVar3 = ValueType::IsString(pVVar9);
    if ((bVar3) && (bVar3 = ValueType::IsDefinite(pVVar8), bVar3)) {
      bVar3 = ValueType::HasBeenString(pVVar8);
      bVar10 = true;
      if (!bVar3) break;
    }
    bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)&DAT_00000001,(bool)uVar6
                      );
LAB_00462618:
    bVar10 = false;
LAB_0046261e:
    if (bVar3 == false) {
      return false;
    }
    break;
  case BrSrNotNeq_A:
switchD_0046166f_caseD_197:
    uVar6 = src2Var != (Var)0x0;
    if (src1Var != (Var)0x0 && (bool)uVar6) {
      pFVar7 = this->func;
      bVar3 = true;
      goto LAB_004625d0;
    }
    pVVar1 = src2Val->valueInfo;
    pVVar8 = &src1Val->valueInfo->super_ValueType;
    bVar3 = ValueType::IsUndefined(pVVar8);
    if (bVar3) {
      bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
      if ((bVar3) && (bVar3 = ValueType::HasBeenUndefined(&pVVar1->super_ValueType), !bVar3))
      goto LAB_0046253f;
    }
    bVar3 = ValueType::IsNull(pVVar8);
    if (bVar3) {
      bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
      if ((bVar3) && (bVar3 = ValueType::HasBeenNull(&pVVar1->super_ValueType), !bVar3))
      goto LAB_0046253f;
    }
    bVar3 = ValueType::IsBoolean(pVVar8);
    if (bVar3) {
      bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
      if ((bVar3) && (bVar3 = ValueType::HasBeenBoolean(&pVVar1->super_ValueType), !bVar3))
      goto LAB_0046253f;
    }
    bVar3 = ValueType::IsNumber(pVVar8);
    if (bVar3) {
      bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
      if ((bVar3) && (bVar3 = ValueType::HasBeenNumber(&pVVar1->super_ValueType), !bVar3))
      goto LAB_0046253f;
    }
    bVar3 = ValueType::IsString(pVVar8);
    if (bVar3) {
      bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
      if ((bVar3) && (bVar3 = ValueType::HasBeenString(&pVVar1->super_ValueType), !bVar3))
      goto LAB_0046253f;
    }
    pVVar9 = &pVVar1->super_ValueType;
    bVar3 = ValueType::IsUndefined(pVVar9);
    if ((((((!bVar3) ||
           ((bVar3 = ValueType::IsDefinite(pVVar8), !bVar3 ||
            (bVar3 = ValueType::HasBeenUndefined(pVVar8), bVar3)))) &&
          ((bVar3 = ValueType::IsNull(pVVar9), !bVar3 ||
           ((bVar3 = ValueType::IsDefinite(pVVar8), !bVar3 ||
            (bVar3 = ValueType::HasBeenNull(pVVar8), bVar3)))))) &&
         ((bVar3 = ValueType::IsBoolean(pVVar9), !bVar3 ||
          ((bVar3 = ValueType::IsDefinite(pVVar8), !bVar3 ||
           (bVar3 = ValueType::HasBeenBoolean(pVVar8), bVar3)))))) &&
        ((bVar3 = ValueType::IsNumber(pVVar9), !bVar3 ||
         ((bVar3 = ValueType::IsDefinite(pVVar8), !bVar3 ||
          (bVar3 = ValueType::HasBeenNumber(pVVar8), bVar3)))))) &&
       ((bVar3 = ValueType::IsString(pVVar9), !bVar3 ||
        ((bVar3 = ValueType::IsDefinite(pVVar8), !bVar3 ||
         (bVar3 = ValueType::HasBeenString(pVVar8), bVar3)))))) goto LAB_0046265d;
LAB_0046253f:
    bVar10 = false;
    break;
  case BrNotGe_A:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
LAB_004624dc:
        bVar11 = SBORROW4((uint)left64,left64._4_4_);
        bVar3 = (int)((uint)left64 - left64._4_4_) < 0;
        goto LAB_004624e2;
      }
      bVar10 = false;
      bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar6);
      if (bVar3) break;
    }
    if ((src2Var == (Var)0x0 || src1Var == (Var)0x0) || (DAT_015bbe7e != '\x01')) goto LAB_004628a0;
    iVar5 = Js::JavascriptOperators::GreaterEqual
                      (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
LAB_00461bc6:
    bVar10 = iVar5 == 0;
    break;
  case BrNotGt_A:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
LAB_00462485:
        bVar12 = SBORROW4((uint)left64,left64._4_4_);
        bVar11 = (int)((uint)left64 - left64._4_4_) < 0;
        bVar3 = (uint)left64 == left64._4_4_;
        goto LAB_0046248b;
      }
      bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar6);
      bVar10 = true;
      if (bVar3) break;
    }
    if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015bbe7e == '\x01')) {
      iVar5 = Js::JavascriptOperators::Greater
                        (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
      goto LAB_00461bc6;
    }
    goto LAB_004628a0;
  case BrNotLt_A:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
LAB_00461b88:
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015bbe7e == '\x01')) {
        iVar5 = Js::JavascriptOperators::Less
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
        goto LAB_00461bc6;
      }
      goto LAB_004628a0;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
LAB_004623d8:
      bVar11 = SBORROW4((uint)left64,left64._4_4_);
      bVar3 = (int)((uint)left64 - left64._4_4_) < 0;
LAB_004623de:
      bVar10 = bVar11 == bVar3;
    }
    else {
      bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar6);
      bVar10 = true;
      if (!bVar3) goto LAB_00461b88;
    }
    break;
  case BrNotLe_A:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
LAB_00461a4e:
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015bbe7e == '\x01')) {
        iVar5 = Js::JavascriptOperators::LessEqual
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
        goto LAB_00461bc6;
      }
      goto LAB_004628a0;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
LAB_0046242f:
      bVar12 = SBORROW4((uint)left64,left64._4_4_);
      bVar11 = (int)((uint)left64 - left64._4_4_) < 0;
      bVar3 = (uint)left64 == left64._4_4_;
LAB_00462435:
      bVar10 = !bVar3 && bVar12 == bVar11;
    }
    else {
      bVar10 = false;
      bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar6);
      if (!bVar3) goto LAB_00461a4e;
    }
    break;
  case BrNotAddr_A:
  case BrAddr_A:
  case BrOnException:
  case BrOnNoException:
  case DeadBrEqual:
  case DeadBrSrEqual:
  case DeadBrRelational:
  case DeadBrOnHasProperty:
  case DeletedNonHelperBranch:
  case BrTrue_I4:
    goto switchD_0046166f_caseD_19c;
  case BrEq_I4:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
        *result = (uint)left64 == left64._4_4_;
      }
      bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
         bVar3)) {
        bVar10 = CONCAT44(right64._4_4_,(int)right64) == local_48;
        break;
      }
LAB_0046265d:
      bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)&DAT_00000001,
                         (bool)uVar6);
      goto LAB_00462667;
    }
    goto LAB_004628a0;
  case BrFalse_I4:
    right64._0_4_ = 0;
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&right64,false);
    if (!bVar3) {
      return false;
    }
    bVar10 = (int)right64 == 0;
    break;
  case BrGe_I4:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
        *result = (int)left64._4_4_ <= (int)(uint)left64;
      }
      bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
         bVar3)) {
        bVar11 = SBORROW8(CONCAT44(right64._4_4_,(int)right64),local_48);
        bVar3 = (long)(CONCAT44(right64._4_4_,(int)right64) - local_48) < 0;
        goto LAB_004623de;
      }
LAB_00461e7c:
      bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar6);
      bVar10 = true;
      goto LAB_0046261e;
    }
    goto LAB_004628a0;
  case BrUnGe_I4:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_004628a0;
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),true), bVar3)) {
      *result = left64._4_4_ <= (uint)left64;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((!bVar3) ||
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,true),
       !bVar3)) goto LAB_00461e7c;
    bVar10 = local_48 <= CONCAT44(right64._4_4_,(int)right64);
    break;
  case BrGt_I4:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
        *result = (int)left64._4_4_ < (int)(uint)left64;
      }
      bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
         bVar3)) {
        uVar2 = CONCAT44(right64._4_4_,(int)right64);
        bVar12 = SBORROW8(uVar2,local_48);
        bVar11 = (long)(uVar2 - local_48) < 0;
        bVar3 = uVar2 == local_48;
        goto LAB_00462435;
      }
LAB_00461fd0:
      bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar6);
      goto LAB_00462618;
    }
    goto LAB_004628a0;
  case BrUnGt_I4:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_004628a0;
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),true), bVar3)) {
      *result = left64._4_4_ < (uint)left64;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((!bVar3) ||
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,true),
       !bVar3)) goto LAB_00461fd0;
    bVar10 = local_48 < CONCAT44(right64._4_4_,(int)right64);
    break;
  case BrLt_I4:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_004628a0;
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
      *result = (int)(uint)left64 < (int)left64._4_4_;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((!bVar3) ||
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
       !bVar3)) goto LAB_00461fd0;
    bVar11 = SBORROW8(CONCAT44(right64._4_4_,(int)right64),local_48);
    bVar3 = (long)(CONCAT44(right64._4_4_,(int)right64) - local_48) < 0;
LAB_004624e2:
    bVar10 = bVar11 != bVar3;
    break;
  case BrUnLt_I4:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_004628a0;
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),true), bVar3)) {
      *result = (uint)left64 < left64._4_4_;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((!bVar3) ||
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,true),
       !bVar3)) goto LAB_00461fd0;
    bVar10 = CONCAT44(right64._4_4_,(int)right64) < local_48;
    break;
  case BrLe_I4:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_004628a0;
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
      *result = (int)(uint)left64 <= (int)left64._4_4_;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((!bVar3) ||
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
       !bVar3)) goto LAB_00461e7c;
    uVar2 = CONCAT44(right64._4_4_,(int)right64);
    bVar12 = SBORROW8(uVar2,local_48);
    bVar11 = (long)(uVar2 - local_48) < 0;
    bVar3 = uVar2 == local_48;
LAB_0046248b:
    bVar10 = bVar3 || bVar12 != bVar11;
    break;
  case BrUnLe_I4:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_004628a0;
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),true), bVar3)) {
      *result = (uint)left64 <= left64._4_4_;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((!bVar3) ||
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,true),
       !bVar3)) goto LAB_00461e7c;
    bVar10 = CONCAT44(right64._4_4_,(int)right64) <= local_48;
    break;
  case BrNeq_I4:
    uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_004628a0;
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3)) {
      *result = (uint)left64 != left64._4_4_;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((!bVar3) ||
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
       !bVar3)) goto LAB_00461fd0;
    bVar3 = CONCAT44(right64._4_4_,(int)right64) == local_48;
LAB_004627e2:
    bVar10 = !bVar3;
    break;
  default:
    switch(instr->m_opcode) {
    case BrEq_A:
      goto switchD_0046166f_caseD_195;
    case BrNeq_A:
      goto switchD_0046166f_caseD_194;
    case BrFalse_A:
    case BrTrue_A:
      pVVar8 = &src1Val->valueInfo->super_ValueType;
      bVar3 = ValueType::IsNull(pVVar8);
      if ((bVar3) || (bVar3 = ValueType::IsUndefined(pVVar8), bVar3)) {
        bVar10 = instr->m_opcode == BrFalse_A;
        goto LAB_004627e5;
      }
      bVar3 = ValueType::IsObject(pVVar8);
      if ((bVar3) && (OVar4 = ValueType::GetObjectType(pVVar8), Object < OVar4)) {
        bVar10 = instr->m_opcode == BrTrue_A;
        goto LAB_004627e5;
      }
      if (src1Var == (Var)0x0) break;
      iVar5 = (*this->func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
      if ((Var)CONCAT44(extraout_var,iVar5) == src1Var) {
        bVar3 = true;
      }
      else {
        iVar5 = (*this->func->m_scriptContextInfo->_vptr_ScriptContextInfo[3])();
        if ((Var)CONCAT44(extraout_var_00,iVar5) == src1Var) {
          bVar3 = false;
        }
        else {
          bVar3 = Js::TaggedInt::Is(src1Var);
          if (bVar3) {
            bVar3 = (undefined1 *)src1Var != &DAT_1000000000000;
          }
          else {
            if ((ulong)src1Var >> 0x32 == 0) break;
            value = Js::JavascriptNumber::GetValue(src1Var);
            bVar3 = Js::NumberUtilities::IsNan(value);
            bVar3 = value != 0.0 && !bVar3;
          }
        }
      }
      *result = bVar3;
      if (instr->m_opcode != BrFalse_A) goto LAB_004627eb;
      bVar10 = *result;
LAB_0046258a:
      bVar10 = bVar10 ^ 1;
      goto LAB_004627e5;
    case BrGe_A:
      uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
        if ((bVar3) &&
           (bVar3 = ValueInfo::TryGetIntConstantValue
                              (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3))
        goto LAB_004623d8;
        bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar6);
        bVar10 = true;
        if (bVar3) goto LAB_004627e5;
      }
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015bbe7e == '\x01')) {
        iVar5 = Js::JavascriptOperators::GreaterEqual
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
LAB_004627e0:
        bVar3 = iVar5 == 0;
        goto LAB_004627e2;
      }
      break;
    case BrGt_A:
      uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
        if ((bVar3) &&
           (bVar3 = ValueInfo::TryGetIntConstantValue
                              (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3))
        goto LAB_0046242f;
        bVar10 = false;
        bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar6);
        if (bVar3) goto LAB_004627e5;
      }
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015bbe7e == '\x01')) {
        iVar5 = Js::JavascriptOperators::Greater
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
        goto LAB_004627e0;
      }
      break;
    case BrLt_A:
      uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
        if ((bVar3) &&
           (bVar3 = ValueInfo::TryGetIntConstantValue
                              (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3))
        goto LAB_004624dc;
        bVar10 = false;
        bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar6);
        if (bVar3) goto LAB_004627e5;
      }
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015bbe7e == '\x01')) {
        iVar5 = Js::JavascriptOperators::Less
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
        goto LAB_004627e0;
      }
      break;
    case BrLe_A:
      uVar6 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
        if ((bVar3) &&
           (bVar3 = ValueInfo::TryGetIntConstantValue
                              (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar3))
        goto LAB_00462485;
        bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar6);
        bVar10 = true;
        if (bVar3) goto LAB_004627e5;
      }
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015bbe7e == '\x01')) {
        iVar5 = Js::JavascriptOperators::LessEqual
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
        goto LAB_004627e0;
      }
      break;
    case BrSrEq_A:
      goto switchD_0046166f_caseD_197;
    case BrSrNeq_A:
      goto switchD_0046166f_caseD_196;
    default:
      goto switchD_0046166f_caseD_19c;
    case BrOnObject_A:
      pVVar8 = &src1Val->valueInfo->super_ValueType;
      bVar3 = ValueType::IsDefinite(pVVar8);
      if (!bVar3) break;
      bVar3 = ValueType::IsPrimitive(pVVar8);
      if (!bVar3) {
        bVar3 = ValueType::HasBeenPrimitive(pVVar8);
        bVar10 = true;
        if (!bVar3) goto LAB_004627e5;
        break;
      }
      goto LAB_0046253f;
    }
LAB_004628a0:
    bVar3 = false;
    goto switchD_0046166f_caseD_19c;
  }
LAB_004627e5:
  *result = (bool)bVar10;
LAB_004627eb:
  bVar3 = true;
switchD_0046166f_caseD_19c:
  return bVar3;
}

Assistant:

bool
GlobOpt::CanProveConditionalBranch(IR::Instr *instr, Value *src1Val, Value *src2Val, Js::Var src1Var, Js::Var src2Var, bool *result)
{
    auto AreSourcesEqual = [&](Value * val1, Value * val2, bool undefinedCmp) -> bool
    {
        // NaN !== NaN, and objects can have valueOf/toString
        if (val1->IsEqualTo(val2))
        {
            if (val1->GetValueInfo()->IsUndefined())
            {
                return undefinedCmp;
            }
            ValueInfo * valInfo = val1->GetValueInfo();
            return !valInfo->HasBeenUndefined() && valInfo->IsPrimitive() && valInfo->IsNotFloat();
        }
        return false;
    };

    // Make sure GetConstantVar only returns primitives.
    // TODO: OOP JIT, enabled these asserts
    //Assert(!src1Var || !Js::JavascriptOperators::IsObject(src1Var));
    //Assert(!src2Var || !Js::JavascriptOperators::IsObject(src2Var));

    int64 left64, right64;
    int32 left, right;
    int32 constVal;

    switch (instr->m_opcode)
    {
#define BRANCHSIGNED(OPCODE,CMP,TYPE,UNSIGNEDNESS,UNDEFINEDCMP) \
    case Js::OpCode::##OPCODE: \
        if (src1Val && src2Val) \
        { \
            if (src1Val->GetValueInfo()->TryGetIntConstantValue(&left, UNSIGNEDNESS) && \
                src2Val->GetValueInfo()->TryGetIntConstantValue(&right, UNSIGNEDNESS)) \
            { \
                *result = (TYPE)left CMP(TYPE)right; \
            } \
            if (src1Val->GetValueInfo()->TryGetInt64ConstantValue(&left64, UNSIGNEDNESS) && \
                src2Val->GetValueInfo()->TryGetInt64ConstantValue(&right64, UNSIGNEDNESS)) \
            { \
                *result = (TYPE)left64 CMP(TYPE)right64; \
            } \
            else if (AreSourcesEqual(src1Val, src2Val, UNDEFINEDCMP)) \
            { \
                *result = 0 CMP 0; \
            } \
            else \
            { \
                return false; \
            } \
        } \
        else \
        { \
            return false; \
        } \
        break;

        BRANCHSIGNED(BrEq_I4, == , int64, false, true)
        BRANCHSIGNED(BrGe_I4, >= , int64, false, false)
        BRANCHSIGNED(BrGt_I4, > , int64, false, false)
        BRANCHSIGNED(BrLt_I4, < , int64, false, false)
        BRANCHSIGNED(BrLe_I4, <= , int64, false, false)
        BRANCHSIGNED(BrNeq_I4, != , int64, false, false)
        BRANCHSIGNED(BrUnGe_I4, >= , uint64, true, false)
        BRANCHSIGNED(BrUnGt_I4, > , uint64, true, false)
        BRANCHSIGNED(BrUnLt_I4, < , uint64, true, false)
        BRANCHSIGNED(BrUnLe_I4, <= , uint64, true, false)
#undef BRANCHSIGNED
#define BRANCH(OPCODE,CMP,VARCMPFUNC,UNDEFINEDCMP) \
    case Js::OpCode::##OPCODE: \
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) && \
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right)) \
        { \
            *result = left CMP right; \
        } \
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, UNDEFINEDCMP)) \
        { \
            *result = 0 CMP 0; \
        } \
        else if (src1Var && src2Var) \
        { \
            if (func->IsOOPJIT() || !CONFIG_FLAG(OOPJITMissingOpts)) \
            { \
                return false; \
            } \
            *result = VARCMPFUNC(src1Var, src2Var, this->func->GetScriptContext()); \
        } \
        else \
        { \
            return false; \
        } \
        break;

    BRANCH(BrGe_A, >= , Js::JavascriptOperators::GreaterEqual, /*undefinedEquality*/ false)
    BRANCH(BrNotGe_A, <, !Js::JavascriptOperators::GreaterEqual, false)
    BRANCH(BrLt_A, <, Js::JavascriptOperators::Less, false)
    BRANCH(BrNotLt_A, >= , !Js::JavascriptOperators::Less, false)
    BRANCH(BrGt_A, >, Js::JavascriptOperators::Greater, false)
    BRANCH(BrNotGt_A, <= , !Js::JavascriptOperators::Greater, false)
    BRANCH(BrLe_A, <= , Js::JavascriptOperators::LessEqual, false)
    BRANCH(BrNotLe_A, >, !Js::JavascriptOperators::LessEqual, false)
#undef BRANCH
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) &&
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right))
        {
            *result = left == right;
        }
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, true))
        {
            *result = true;
        }
        else if (!src1Var || !src2Var)
        {
            if (BoolAndIntStaticAndTypeMismatch(src1Val, src2Val, src1Var, src2Var))
            {
                *result = false;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitEq(result, src1Val, src2Val, src1Var, src2Var, this->func, false /* isStrict */))
            {
                return false;
            }
        }
        break;
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNotEq_A:
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) &&
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right))
        {
            *result = left != right;
        }
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, true))
        {
            *result = false;
        }
        else if (!src1Var || !src2Var)
        {
            if (BoolAndIntStaticAndTypeMismatch(src1Val, src2Val, src1Var, src2Var))
            {
                *result = true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitNeq(result, src1Val, src2Val, src1Var, src2Var, this->func, false /* isStrict */))
            {
                return false;
            }
        }
        break;
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
        if (!src1Var || !src2Var)
        {
            ValueInfo *src1ValInfo = src1Val->GetValueInfo();
            ValueInfo *src2ValInfo = src2Val->GetValueInfo();
            if (
                (src1ValInfo->IsUndefined() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenUndefined()) ||
                (src1ValInfo->IsNull() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNull()) ||
                (src1ValInfo->IsBoolean() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenBoolean()) ||
                (src1ValInfo->IsNumber() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNumber()) ||
                (src1ValInfo->IsString() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenString()) ||

                (src2ValInfo->IsUndefined() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenUndefined()) ||
                (src2ValInfo->IsNull() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNull()) ||
                (src2ValInfo->IsBoolean() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenBoolean()) ||
                (src2ValInfo->IsNumber() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNumber()) ||
                (src2ValInfo->IsString() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenString())
                )
            {
                *result = false;
            }
            else if (AreSourcesEqual(src1Val, src2Val, true))
            {
                *result = true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitEq(result, src1Val, src2Val, src1Var, src2Var, this->func, true /* isStrict */))
            {
                return false;
            }
        }
        break;

    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
        if (!src1Var || !src2Var)
        {
            ValueInfo *src1ValInfo = src1Val->GetValueInfo();
            ValueInfo *src2ValInfo = src2Val->GetValueInfo();
            if (
                (src1ValInfo->IsUndefined() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenUndefined()) ||
                (src1ValInfo->IsNull() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNull()) ||
                (src1ValInfo->IsBoolean() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenBoolean()) ||
                (src1ValInfo->IsNumber() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNumber()) ||
                (src1ValInfo->IsString() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenString()) ||

                (src2ValInfo->IsUndefined() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenUndefined()) ||
                (src2ValInfo->IsNull() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNull()) ||
                (src2ValInfo->IsBoolean() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenBoolean()) ||
                (src2ValInfo->IsNumber() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNumber()) ||
                (src2ValInfo->IsString() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenString())
                )
            {
                *result = true;
            }
            else if (AreSourcesEqual(src1Val, src2Val, true))
            {
                *result = false;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitNeq(result, src1Val, src2Val, src1Var, src2Var, this->func, true /* isStrict */))
            {
                return false;
            }
        }
        break;

    case Js::OpCode::BrFalse_A:
    case Js::OpCode::BrTrue_A:
    {
        ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
        if (src1ValueInfo->IsNull() || src1ValueInfo->IsUndefined())
        {
            *result = instr->m_opcode == Js::OpCode::BrFalse_A;
            break;
        }
        if (src1ValueInfo->IsObject() && src1ValueInfo->GetObjectType() > ObjectType::Object)
        {
            // Specific object types that are tracked are equivalent to 'true'
            *result = instr->m_opcode == Js::OpCode::BrTrue_A;
            break;
        }

        if (!src1Var)
        {
            return false;
        }

        // Set *result = (evaluates true) and negate it later for BrFalse
        if (src1Var == reinterpret_cast<Js::Var>(this->func->GetScriptContextInfo()->GetTrueAddr()))
        {
            *result = true;
        }
        else if (src1Var == reinterpret_cast<Js::Var>(this->func->GetScriptContextInfo()->GetFalseAddr()))
        {
            *result = false;
        }
        else if (Js::TaggedInt::Is(src1Var))
        {
            *result = (src1Var != reinterpret_cast<Js::Var>(Js::AtomTag_IntPtr));
        }
#if FLOATVAR
        else if (Js::JavascriptNumber::Is_NoTaggedIntCheck(src1Var))
        {
            double value = Js::JavascriptNumber::GetValue(src1Var);
            *result = (!Js::JavascriptNumber::IsNan(value)) && (!Js::JavascriptNumber::IsZero(value));
        }
#endif
        else
        {
            return false;
        }

        if (instr->m_opcode == Js::OpCode::BrFalse_A)
        {
            *result = !(*result);
        }
        break;
    }
    case Js::OpCode::BrFalse_I4:
    {
        constVal = 0;
        if (!src1Val->GetValueInfo()->TryGetIntConstantValue(&constVal))
        {
            return false;
        }

        *result = constVal == 0;
        break;
    }
    case Js::OpCode::BrOnObject_A:
    {
        ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
        if (!src1ValueInfo->IsDefinite())
        {
            return false;
        }

        if (src1ValueInfo->IsPrimitive())
        {
            *result = false;
        }
        else
        {
            if (src1ValueInfo->HasBeenPrimitive())
            {
                return false;
            }
            *result = true;
        }

        break;
    }
    default:
        return false;
    }
    return true;
}